

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O0

void run_schnorrsig_tests(void)

{
  int i;
  undefined4 local_4;
  
  run_nonce_function_bip340_tests();
  test_schnorrsig_api();
  test_schnorrsig_sha256_tagged();
  test_schnorrsig_bip_vectors();
  for (local_4 = 0; local_4 < COUNT; local_4 = local_4 + 1) {
    test_schnorrsig_sign();
    test_schnorrsig_sign_verify();
  }
  test_schnorrsig_taproot();
  return;
}

Assistant:

static void run_schnorrsig_tests(void) {
    int i;
    run_nonce_function_bip340_tests();

    test_schnorrsig_api();
    test_schnorrsig_sha256_tagged();
    test_schnorrsig_bip_vectors();
    for (i = 0; i < COUNT; i++) {
        test_schnorrsig_sign();
        test_schnorrsig_sign_verify();
    }
    test_schnorrsig_taproot();
}